

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer_Base.cpp
# Opt level: O3

void __thiscall OSTEI_Writer_Base::DeclarePrimPointers(OSTEI_Writer_Base *this)

{
  QAM *tam;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OSTEI_HRR_Algorithm_Base *this_00;
  ostream *poVar2;
  _Base_ptr p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  QAMSet topq;
  string local_f8;
  string local_d8;
  string local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [24];
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_60;
  
  this_00 = OSTEI_HRR_Writer::Algo(this->hrr_writer_);
  OSTEI_HRR_Algorithm_Base::TopAM((QAMSet *)&local_60,this_00);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    paVar1 = &local_f8.field_2;
    p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->os_,indent4_abi_cxx11_._M_dataplus._M_p,
                          indent4_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"double * restrict ",0x12);
      tam = (QAM *)(p_Var3 + 1);
      local_f8.field_2._M_allocated_capacity = 0x5254505f4d495250;
      local_f8._M_string_length = 8;
      local_f8.field_2._M_local_buf[8] = '\0';
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      ArrVarName(&local_b8,tam,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
      ArrVarName(&local_f8,tam,&local_d8);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," + abcd * ",10);
      local_98 = *(undefined8 *)(tam->qam)._M_elems;
      uStack_90 = p_Var3[1]._M_parent;
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,p_Var3[1]._M_left,
                 (long)&(p_Var3[1]._M_left)->_M_color + (long)&(p_Var3[1]._M_right)->_M_color);
      auVar4._0_4_ = (int)local_98 + 2;
      auVar4._4_4_ = local_98._4_4_ + 2;
      auVar4._8_4_ = (int)uStack_90 + 2;
      auVar4._12_4_ = uStack_90._4_4_ + 2;
      auVar5._4_4_ = local_98._4_4_ + 1;
      auVar5._12_4_ = uStack_90._4_4_ + 1;
      auVar5._0_4_ = auVar5._4_4_;
      auVar5._8_4_ = auVar5._12_4_;
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar2,
                          (~((int)uStack_90 >> 0x1f) &
                          (uint)((auVar4._8_8_ & 0xffffffff) * (ulong)((int)uStack_90 + 1)) >> 1) *
                          (~((int)local_98 >> 0x1f) &
                          (uint)(auVar4._0_4_ * ((int)local_98 + 1)) >> 1) *
                          (~(local_98._4_4_ >> 0x1f) & (uint)(auVar5._4_4_ * auVar4._4_4_) >> 1) *
                          (~(uStack_90._4_4_ >> 0x1f) &
                          (uint)((auVar5._8_8_ & 0xffffffff) * (ulong)auVar4._12_4_) >> 1));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\n\n",2);
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void OSTEI_Writer_Base::DeclarePrimPointers(void) const
{
    auto topq = hrr_writer_.Algo().TopAM();
    for(const auto & it : topq)
    {
        os_ << indent4 << "double * restrict " << PrimPtrName(it)
            << " = " << ArrVarName(it) << " + abcd * " << NCART(it) << ";\n";
    }

    os_ << "\n\n";
}